

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

float Catch::anon_unknown_1::step<float>(float start,float direction,uint64_t steps)

{
  bool bVar1;
  
  while (bVar1 = steps != 0, steps = steps - 1, bVar1) {
    start = nextafterf(start,direction);
  }
  return start;
}

Assistant:

FP step(FP start, FP direction, uint64_t steps) {
    for (uint64_t i = 0; i < steps; ++i) {
#if defined(CATCH_CONFIG_GLOBAL_NEXTAFTER)
        start = Catch::nextafter(start, direction);
#else
        start = std::nextafter(start, direction);
#endif
    }
    return start;
}